

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O1

void glob_cleanup(URLGlob *glob)

{
  long lVar1;
  ulong uVar2;
  
  if (glob != (URLGlob *)0x0) {
    if (glob->size != 0) {
      uVar2 = 0;
      do {
        if ((glob->pattern[uVar2].type == UPTSet) &&
           (glob->pattern[uVar2].content.Set.elements != (char **)0x0)) {
          lVar1 = (long)glob->pattern[uVar2].content.Set.size;
          if (0 < lVar1) {
            lVar1 = lVar1 + 1;
            do {
              free(*(void **)((glob->pattern[uVar2].content.NumRange.min_n - 0x10) + lVar1 * 8));
              *(undefined8 *)((glob->pattern[uVar2].content.NumRange.min_n - 0x10) + lVar1 * 8) = 0;
              lVar1 = lVar1 + -1;
            } while (1 < lVar1);
          }
          free(glob->pattern[uVar2].content.Set.elements);
          glob->pattern[uVar2].content.Set.elements = (char **)0x0;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < glob->size);
    }
    free(glob->glob_buffer);
    glob->glob_buffer = (char *)0x0;
    free(glob);
    return;
  }
  return;
}

Assistant:

void glob_cleanup(struct URLGlob *glob)
{
  size_t i;
  int elem;

  if(!glob)
    return;

  for(i = 0; i < glob->size; i++) {
    if((glob->pattern[i].type == UPTSet) &&
       (glob->pattern[i].content.Set.elements)) {
      for(elem = glob->pattern[i].content.Set.size - 1;
          elem >= 0;
          --elem) {
        Curl_safefree(glob->pattern[i].content.Set.elements[elem]);
      }
      Curl_safefree(glob->pattern[i].content.Set.elements);
    }
  }
  Curl_safefree(glob->glob_buffer);
  Curl_safefree(glob);
}